

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTFactory.cpp
# Opt level: O0

int __thiscall antlr::ASTFactory::dup(ASTFactory *this,int __fd)

{
  AST *pAVar1;
  ASTRefCount *in_RDX;
  int iVar2;
  ASTFactory *this_00;
  
  this_00 = this;
  pAVar1 = ASTRefCount::operator_cast_to_AST_(in_RDX);
  if (pAVar1 == (AST *)0x0) {
    ASTRefCount<antlr::AST>::ASTRefCount((ASTRefCount<antlr::AST> *)this_00,(AST *)this);
    iVar2 = (int)this_00;
  }
  else {
    pAVar1 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RDX);
    iVar2 = (int)this_00;
    (*pAVar1->_vptr_AST[3])(this);
  }
  return iVar2;
}

Assistant:

RefAST ASTFactory::dup(RefAST t)
{
	if( t )
		return t->clone();
	else
		return RefAST(nullASTptr);
}